

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O3

int Gia_ManSeqMarkUsed(Gia_Man_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  int iVar6;
  
  Gia_ManSetMark0(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  pVVar4 = p->vCis;
  uVar5 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar3 = 0;
    do {
      if ((int)uVar5 <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pVVar4->pArray[lVar3];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00223851;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar6].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar3 = lVar3 + 1;
      pVVar4 = p->vCis;
      uVar5 = (ulong)pVVar4->nSize;
    } while (lVar3 < (long)(uVar5 - (long)p->nRegs));
  }
  pVVar4 = Gia_ManCollectPoIds(p);
  if (pVVar4->nSize < 1) {
    iVar6 = 0;
  }
  else {
    lVar3 = 0;
    iVar6 = 0;
    do {
      iVar2 = pVVar4->pArray[lVar3];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_00223851:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ManSeqMarkUsed_rec(p,p->pObjs + iVar2,pVVar4);
      iVar6 = iVar6 + iVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  return iVar6;
}

Assistant:

int Gia_ManSeqMarkUsed( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Gia_ManSetMark0( p );
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark0 = 0;
    vRoots = Gia_ManCollectPoIds( p );
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
        nNodes += Gia_ManSeqMarkUsed_rec( p, pObj, vRoots );
    Vec_IntFree( vRoots );
    return nNodes;
}